

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmULT.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  UnitTest *this;
  int local_1c [2];
  int argc_local;
  
  local_1c[0] = argc;
  testing::InitGoogleTest(local_1c,argv);
  g_argc = local_1c[0];
  g_argv = argv;
  this = testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run(this);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    int FailCount = 0;

    testing::InitGoogleTest(&argc, argv);

    g_argc = argc;
    g_argv = argv;

    FailCount += RUN_ALL_TESTS();

    return FailCount;
}